

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamStandardIndex::BamStandardIndex
          (BamStandardIndex *this,BamReaderPrivate *reader)

{
  (this->super_BamIndex).m_reader = reader;
  (this->super_BamIndex).m_errorString._M_dataplus._M_p =
       (pointer)&(this->super_BamIndex).m_errorString.field_2;
  (this->super_BamIndex).m_errorString._M_string_length = 0;
  (this->super_BamIndex).m_errorString.field_2._M_local_buf[0] = '\0';
  (this->super_BamIndex)._vptr_BamIndex = (_func_int **)&PTR__BamStandardIndex_001717b8;
  (this->m_indexFileSummary).
  super__Vector_base<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_indexFileSummary).
  super__Vector_base<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_indexFileSummary).
           super__Vector_base<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_indexFileSummary).
           super__Vector_base<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  RaiiWrapper::RaiiWrapper(&this->m_resources);
  this->m_isBigEndian = false;
  return;
}

Assistant:

BamStandardIndex::BamStandardIndex(Internal::BamReaderPrivate* reader)
    : BamIndex(reader)
    , m_bufferLength(0)
{
     m_isBigEndian = BamTools::SystemIsBigEndian();
}